

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_struct_field
          (OneofWellKnownTypes *this,Struct *struct_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Struct *struct_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (struct_field != (Struct *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)struct_field);
    message_arena = (Arena *)struct_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::Struct>
                              (message_arena_00,struct_field,submessage_arena_00);
    }
    set_has_struct_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_struct_field(::google::protobuf::Struct* PROTOBUF_NULLABLE struct_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (struct_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(struct_field)->GetArena();
    if (message_arena != submessage_arena) {
      struct_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, struct_field, submessage_arena);
    }
    set_has_struct_field();
    _impl_.oneof_field_.struct_field_ = struct_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.struct_field)
}